

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void crnlib::end_zero_run(uint *size,vector<unsigned_short> *codes)

{
  short sVar1;
  uint uVar2;
  unsigned_short uVar3;
  unsigned_short *obj;
  unsigned_short local_1e;
  unsigned_short local_1c;
  unsigned_short local_1a;
  
  uVar2 = *size;
  if (uVar2 != 0) {
    if (uVar2 < 3) {
      while (*size = uVar2 - 1, uVar2 != 0) {
        local_1e = 0;
        vector<unsigned_short>::push_back(codes,&local_1e);
        uVar2 = *size;
      }
    }
    else {
      sVar1 = (short)uVar2 * 0x100;
      if (uVar2 < 0xb) {
        uVar3 = sVar1 - 0x2ef;
        obj = &local_1a;
      }
      else {
        uVar3 = sVar1 - 0xaee;
        obj = &local_1c;
      }
      *obj = uVar3;
      vector<unsigned_short>::push_back(codes,obj);
    }
    *size = 0;
  }
  return;
}

Assistant:

static inline void end_zero_run(uint& size, crnlib::vector<uint16>& codes)
    {
        if (!size)
        {
            return;
        }

        if (size < cMinSmallZeroRunSize)
        {
            while (size--)
            {
                codes.push_back(0);
            }
        }
        else if (size <= cMaxSmallZeroRunSize)
        {
            codes.push_back(static_cast<uint16>(cSmallZeroRunCode | ((size - cMinSmallZeroRunSize) << 8)));
        }
        else
        {
            CRNLIB_ASSERT((size >= cMinLargeZeroRunSize) && (size <= cMaxLargeZeroRunSize));
            codes.push_back(static_cast<uint16>(cLargeZeroRunCode | ((size - cMinLargeZeroRunSize) << 8)));
        }

        size = 0;
    }